

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPDeviceClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDeviceClause *this)

{
  ulong uVar1;
  string local_78;
  OpenMPDeviceClauseModifier local_58;
  allocator<char> local_51;
  OpenMPDeviceClauseModifier modifier;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPDeviceClause *local_18;
  OpenMPDeviceClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPDeviceClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"device ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&modifier,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_58 = getModifier(this);
  if (local_58 == OMPC_DEVICE_MODIFIER_ancestor) {
    std::__cxx11::string::operator+=((string *)&modifier,"ancestor");
  }
  else if (local_58 == OMPC_DEVICE_MODIFIER_device_num) {
    std::__cxx11::string::operator+=((string *)&modifier,"device_num");
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&modifier," : ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_78,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator+=((string *)&modifier,") ");
  uVar1 = std::__cxx11::string::size();
  if (3 < uVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&modifier);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDeviceClause::toString() {

    std::string result = "device ";
    std::string clause_string = "(";
    OpenMPDeviceClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_DEVICE_MODIFIER_ancestor:
            clause_string += "ancestor";
            break;
        case OMPC_DEVICE_MODIFIER_device_num:
            clause_string += "device_num";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}